

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-reporter.h
# Opt level: O0

void __thiscall
capnp::compiler::ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
          (ErrorReporter *this,Reader *decl,StringPtr message)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Reader *decl_local;
  ErrorReporter *this_local;
  StringPtr message_local;
  
  uVar1 = LocatedText::Reader::getStartByte(decl);
  uVar2 = LocatedText::Reader::getEndByte(decl);
  (**this->_vptr_ErrorReporter)
            (this,(ulong)uVar1,(ulong)uVar2,message.content.ptr,message.content.size_);
  return;
}

Assistant:

inline void addErrorOn(T&& decl, kj::StringPtr message) {
    // Works for any `T` that defines `getStartByte()` and `getEndByte()` methods, which many
    // of the Cap'n Proto types defined in `grammar.capnp` do.

    addError(decl.getStartByte(), decl.getEndByte(), message);
  }